

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

void __thiscall Pathie::PathieError::PathieError(PathieError *this,string *message)

{
  *(undefined ***)this = &PTR__GlobError_00113bd0;
  (this->m_pathie_errmsg)._M_dataplus._M_p = (pointer)&(this->m_pathie_errmsg).field_2;
  (this->m_pathie_errmsg)._M_string_length = 0;
  (this->m_pathie_errmsg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_pathie_errmsg);
  return;
}

Assistant:

PathieError::PathieError(std::string message)
{
  m_pathie_errmsg = message;
}